

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O1

void test_drawonable_fns(void)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined1 *puVar4;
  Am_Style aAStack_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  
  puts("Testing higher-level Am_Drawonable member functions:");
  puts("  Hit RETURN to clip black rect to drawonable\'s clip_region");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  (**(code **)(*(long *)d1 + 0xf8))(d1,0x96,0x32,0x50,0x28);
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&black,0,0,300,200,0);
  (**(code **)(*(long *)d1 + 0xa0))();
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping:  ");
  Am_Style::Am_Style(local_40,(Am_Style *)&red);
  Am_Style::Am_Style(local_48,(Am_Style *)&green);
  Am_Style::Am_Style(local_50,(Am_Style *)&blue);
  Am_Style::Am_Style(local_58,(Am_Style *)&white);
  Am_Style::Am_Style(local_60,(Am_Style *)&black);
  Am_Style::Am_Style(aAStack_68,(Am_Style *)&yellow);
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  set_style_array(local_40,local_48,local_50,local_58,local_60,aAStack_68,local_30,local_38);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_30);
  Am_Style::~Am_Style(aAStack_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  iVar1 = 10;
  puVar4 = style_array;
  lVar3 = -6;
  do {
    getchar();
    printf("%d  ",(ulong)((int)lVar3 + 7));
    (**(code **)(*(long *)d1 + 0x108))(d1,iVar1,iVar1,0x96,0x96);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,puVar4,0,0,300,200,0);
    (**(code **)(*(long *)d1 + 0xa0))();
    iVar1 = iVar1 + 10;
    puVar4 = puVar4 + 8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  putchar(10);
  printf("  Hit RETURN 6 times to pop Am_Drawonable clipping:  ");
  uVar2 = 1;
  do {
    getchar();
    printf("%d  ",(ulong)uVar2);
    (**(code **)(*(long *)d1 + 0x110))();
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&purple,0,0,300,200,0);
    (**(code **)(*(long *)d1 + 0xa0))();
    uVar2 = uVar2 + 1;
  } while (uVar2 != 7);
  putchar(10);
  printf("  Hit RETURN 2 times to push again into that same Am_Drawonable:  ");
  iVar1 = 0x32;
  lVar3 = -1;
  puVar4 = style_array;
  do {
    getchar();
    printf("%d  ",(ulong)((int)lVar3 + 2));
    (**(code **)(*(long *)d1 + 0x108))(d1,iVar1,iVar1,200,0x32);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,puVar4,0,0,300,200,0);
    (**(code **)(*(long *)d1 + 0xa0))();
    iVar1 = iVar1 + 10;
    puVar4 = puVar4 + 8;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 0);
  putchar(10);
  return;
}

Assistant:

void
test_drawonable_fns()
{
  printf("Testing higher-level Am_Drawonable member functions:\n");

  printf("  Hit RETURN to clip black rect to drawonable's clip_region\n");
  getchar();

  d1->Clear_Clip();
  clear_whole_window(d1);
  ;
  d1->Set_Clip(150, 50, 80, 40);
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Flush_Output();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping:  ");
  set_style_array(red, green, blue, white, black, yellow);
  d1->Clear_Clip();
  clear_whole_window(d1);
  ;

  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(10 + 10 * counter, 10 + 10 * counter, 150, 150);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 6 times to pop Am_Drawonable clipping:  ");
  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Pop_Clip();
    d1->Draw_Rectangle(Am_No_Style, purple, 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 2 times to push again into that same Am_Drawonable:  ");
  for (counter = 0; counter <= 1; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(50 + 10 * counter, 50 + 10 * counter, 200, 50);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}